

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

bool __thiscall
brotli::HashLongestMatchQuickly<16,_1,_true>::FindLongestMatch
          (HashLongestMatchQuickly<16,_1,_true> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  int *piVar1;
  double dVar2;
  uint8_t uVar3;
  ushort uVar4;
  int iVar5;
  bool bVar6;
  uint8_t *puVar7;
  int *piVar8;
  uint8_t *puVar9;
  size_t sVar10;
  uint uVar11;
  long lVar12;
  uint32_t uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int *local_38;
  
  uVar13 = (uint32_t)cur_ix;
  sVar10 = *best_len_out;
  piVar1 = (int *)(ring_buffer + (cur_ix & ring_buffer_mask));
  uVar16 = (ulong)(*(long *)(ring_buffer + (cur_ix & ring_buffer_mask)) * 0x1e35a7bd000000) >> 0x30;
  uVar3 = *(uint8_t *)(sVar10 + (long)piVar1);
  dVar2 = *best_score_out;
  iVar5 = *distance_cache;
  uVar19 = cur_ix - (long)iVar5;
  if ((uVar19 < cur_ix) &&
     (uVar18 = (uint)uVar19 & (uint)ring_buffer_mask, uVar3 == ring_buffer[sVar10 + uVar18])) {
    if (7 < max_length) {
      uVar19 = max_length & 0xfffffffffffffff8;
      local_38 = (int *)((long)piVar1 + uVar19);
      lVar12 = 0;
      uVar20 = 0;
LAB_0016e49a:
      if (*(ulong *)(piVar1 + uVar20 * 2) == *(ulong *)(ring_buffer + uVar20 * 8 + (ulong)uVar18))
      goto code_r0x0016e4ab;
      uVar20 = *(ulong *)(ring_buffer + uVar20 * 8 + (ulong)uVar18) ^
               *(ulong *)(piVar1 + uVar20 * 2);
      uVar19 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      uVar20 = (uVar19 >> 3 & 0x1fffffff) - lVar12;
      goto LAB_0016e4ed;
    }
    uVar19 = 0;
    local_38 = piVar1;
LAB_0016e81f:
    uVar17 = max_length & 7;
    uVar20 = uVar19;
    if (uVar17 != 0) {
      uVar15 = uVar19 | uVar17;
      do {
        uVar20 = uVar19;
        if (ring_buffer[uVar19 + uVar18] != (uint8_t)*local_38) break;
        local_38 = (int *)((long)local_38 + 1);
        uVar19 = uVar19 + 1;
        uVar17 = uVar17 - 1;
        uVar20 = uVar15;
      } while (uVar17 != 0);
    }
LAB_0016e4ed:
    if (3 < uVar20) {
      auVar23._8_4_ = (int)(uVar20 >> 0x20);
      auVar23._0_8_ = uVar20;
      auVar23._12_4_ = 0x45300000;
      *best_len_out = uVar20;
      *best_len_code_out = uVar20;
      *best_distance_out = (long)iVar5;
      *best_score_out =
           ((auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0)) * 5.4 + 0.6;
      this->buckets_[uVar16] = uVar13;
      return true;
    }
  }
  uVar18 = this->buckets_[uVar16];
  this->buckets_[uVar16] = uVar13;
  uVar11 = (uint)ring_buffer_mask & uVar18;
  if ((uVar3 == ring_buffer[sVar10 + uVar11]) && (bVar21 = false, cur_ix != uVar18)) {
    uVar19 = cur_ix - uVar18;
    bVar6 = false;
    if (uVar19 <= max_backward) {
      if (7 < max_length) {
        uVar20 = max_length & 0xfffffffffffffff8;
        piVar8 = (int *)((long)piVar1 + uVar20);
        lVar12 = 0;
        uVar17 = 0;
LAB_0016e5b1:
        if (*(ulong *)(piVar1 + uVar17 * 2) == *(ulong *)(ring_buffer + uVar17 * 8 + (ulong)uVar11))
        goto code_r0x0016e5c1;
        uVar17 = *(ulong *)(ring_buffer + uVar17 * 8 + (ulong)uVar11) ^
                 *(ulong *)(piVar1 + uVar17 * 2);
        uVar20 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar17 = (uVar20 >> 3 & 0x1fffffff) - lVar12;
        goto LAB_0016e5fe;
      }
      uVar20 = 0;
      piVar8 = piVar1;
LAB_0016e7e7:
      uVar15 = max_length & 7;
      uVar17 = uVar20;
      if (uVar15 != 0) {
        uVar14 = uVar20 | uVar15;
        do {
          uVar17 = uVar20;
          if (ring_buffer[uVar20 + uVar11] != (uint8_t)*piVar8) break;
          piVar8 = (int *)((long)piVar8 + 1);
          uVar20 = uVar20 + 1;
          uVar15 = uVar15 - 1;
          uVar17 = uVar14;
        } while (uVar15 != 0);
      }
LAB_0016e5fe:
      bVar6 = true;
      bVar21 = uVar17 < 4;
      if (!bVar21) {
        *best_len_out = uVar17;
        *best_len_code_out = uVar17;
        auVar24._8_4_ = (int)(uVar17 >> 0x20);
        auVar24._0_8_ = uVar17;
        auVar24._12_4_ = 0x45300000;
        iVar5 = 0x1f;
        if ((uint)uVar19 != 0) {
          for (; (uint)uVar19 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        *best_distance_out = uVar19;
        *best_score_out =
             ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) * 5.4 +
             (double)iVar5 * -1.2;
        bVar21 = false;
      }
    }
  }
  else {
    bVar21 = false;
    bVar6 = false;
  }
  if (!bVar21) {
    return bVar6;
  }
  if (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_) {
    this->num_dict_lookups_ = this->num_dict_lookups_ + 1;
    uVar4 = *(ushort *)(kStaticDictionaryHash + (ulong)((uint)(*piVar1 * 0x1e35a7bd) >> 0x12) * 4);
    if (uVar4 != 0) {
      uVar18 = uVar4 & 0x1f;
      uVar19 = (ulong)uVar18;
      if (uVar19 <= max_length) {
        puVar7 = kBrotliDictionary +
                 (uVar18 * (uVar4 >> 5) + kBrotliDictionaryOffsetsByLength[uVar19]);
        if (7 < uVar18) {
          uVar17 = (ulong)(uVar4 & 0x18);
          puVar9 = puVar7 + uVar17;
          uVar20 = 0;
LAB_0016e6f4:
          if (*(ulong *)(puVar7 + uVar20) == *(ulong *)((long)piVar1 + uVar20))
          goto code_r0x0016e704;
          uVar15 = *(ulong *)((long)piVar1 + uVar20) ^ *(ulong *)(puVar7 + uVar20);
          uVar17 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar20 = (uVar17 >> 3 & 0x1fffffff) + uVar20;
          goto LAB_0016e726;
        }
        uVar17 = 0;
        puVar9 = puVar7;
LAB_0016e862:
        uVar15 = uVar19 & 7;
        uVar20 = uVar17;
        if ((uVar4 & 7) != 0) {
          uVar14 = uVar17 | uVar15;
          do {
            uVar20 = uVar17;
            if (*(uint8_t *)((long)piVar1 + uVar17) != *puVar9) break;
            puVar9 = puVar9 + 1;
            uVar17 = uVar17 + 1;
            uVar15 = uVar15 - 1;
            uVar20 = uVar14;
          } while (uVar15 != 0);
        }
LAB_0016e726:
        bVar21 = false;
        if ((uVar20 != 0) && (bVar21 = false, uVar19 < uVar20 + 10)) {
          auVar25._8_4_ = (int)(uVar20 >> 0x20);
          auVar25._0_8_ = uVar20;
          auVar25._12_4_ = 0x45300000;
          sVar10 = (long)(1 << (""[uVar19] & 0x1f)) *
                   (ulong)(byte)kCutoffTransforms[uVar19 - uVar20] + max_backward + (uVar4 >> 5) + 1
          ;
          iVar5 = 0x1f;
          uVar18 = (uint)sVar10;
          if (uVar18 != 0) {
            for (; uVar18 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          dVar22 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar20) - 4503599627370496.0)) * 5.4 +
                   (double)iVar5 * -1.2;
          bVar21 = dVar2 < dVar22;
          if (dVar2 < dVar22) {
            this->num_dict_matches_ = this->num_dict_matches_ + 1;
            *best_len_out = uVar20;
            *best_len_code_out = uVar19;
            *best_distance_out = sVar10;
            *best_score_out = dVar22;
            bVar21 = true;
          }
        }
        goto LAB_0016e6b6;
      }
    }
  }
  bVar21 = false;
LAB_0016e6b6:
  this->buckets_[uVar16] = uVar13;
  return bVar21;
code_r0x0016e4ab:
  uVar20 = uVar20 + 1;
  lVar12 = lVar12 + -8;
  if (max_length >> 3 == uVar20) goto LAB_0016e81f;
  goto LAB_0016e49a;
code_r0x0016e5c1:
  uVar17 = uVar17 + 1;
  lVar12 = lVar12 + -8;
  if (max_length >> 3 == uVar17) goto LAB_0016e7e7;
  goto LAB_0016e5b1;
code_r0x0016e704:
  uVar20 = uVar20 + 8;
  if (uVar17 == uVar20) goto LAB_0016e862;
  goto LAB_0016e6f4;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }